

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O3

void __thiscall string_view_empty_Test::TestBody(string_view_empty_Test *this)

{
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(string_view, empty) {
  string_view sv1;
  ASSERT_TRUE(sv1.empty());

  string_view sv2("bye");
  ASSERT_FALSE(sv2.empty());
}